

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EAM.cpp
# Opt level: O0

void __thiscall OpenMD::EAM::addType(EAM *this,AtomType *atomType)

{
  undefined1 uVar1;
  undefined1 uVar2;
  bool bVar3;
  double *pdVar4;
  undefined8 uVar5;
  size_type sVar6;
  _Rb_tree_const_iterator<int> this_00;
  reference pvVar7;
  vector<int,_std::allocator<int>_> *this_01;
  reference piVar8;
  reference pvVar9;
  AtomType *in_RSI;
  long in_RDI;
  vector<double,_std::allocator<double>_> *OrhoLimits_00;
  vector<double,_std::allocator<double>_> *OrhoE_00;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  *OF_00;
  EAMAdapter *this_02;
  pair<std::_Rb_tree_const_iterator<int>,_bool> pVar10;
  pair<double,_double> pVar11;
  EAMInteractionData mixer;
  AtomType *atype2;
  int eamtid2;
  iterator it;
  pair<std::_Rb_tree_const_iterator<int>,_bool> ret;
  int eamtid;
  int atid;
  FluctuatingChargeAdapter fqa;
  int i_7;
  int i_6;
  vector<double,_std::allocator<double>_> funcvals_1;
  vector<double,_std::allocator<double>_> rhovals_2;
  vector<double,_std::allocator<double>_> cvvals_2;
  vector<double,_std::allocator<double>_> ccvals_2;
  vector<double,_std::allocator<double>_> zvals_2;
  vector<double,_std::allocator<double>_> rvals_2;
  RealType phiCV_2;
  RealType phiCC_2;
  RealType rho_1;
  RealType drho_1;
  RealType rhomax_1;
  int Nrho_1;
  RealType r_2;
  RealType dr_2;
  int Nr_2;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  OF;
  vector<double,_std::allocator<double>_> OrhoE;
  vector<double,_std::allocator<double>_> OrhoLimits;
  RealType nu;
  RealType gamma;
  RealType lambda_2;
  RealType kappa_2;
  RealType beta_2;
  RealType alpha_2;
  RealType B_2;
  RealType A_2;
  RealType fe_2;
  RealType re_2;
  int i_5;
  vector<double,_std::allocator<double>_> rhovals_1;
  vector<double,_std::allocator<double>_> cvvals_1;
  vector<double,_std::allocator<double>_> ccvals_1;
  vector<double,_std::allocator<double>_> zvals_1;
  vector<double,_std::allocator<double>_> rvals_1;
  RealType phiCV_1;
  RealType phiCC_1;
  RealType r_1;
  RealType dr_1;
  int Nr_1;
  RealType lambda_1;
  RealType kappa_1;
  RealType beta_1;
  RealType alpha_1;
  RealType B_1;
  RealType A_1;
  RealType fe_1;
  RealType re_1;
  int i_4;
  int i_3;
  RealType F3minus;
  RealType F3plus;
  RealType rhos_1;
  int i_2;
  RealType rhoh;
  RealType rhol;
  RealType rhos;
  int i_1;
  int i;
  vector<double,_std::allocator<double>_> funcvals;
  vector<double,_std::allocator<double>_> rhovals;
  vector<double,_std::allocator<double>_> cvvals;
  vector<double,_std::allocator<double>_> ccvals;
  vector<double,_std::allocator<double>_> zvals;
  vector<double,_std::allocator<double>_> rvals;
  RealType phiCV;
  RealType phiCC;
  RealType rho;
  RealType drho;
  RealType rhomax;
  int Nrho;
  RealType r;
  RealType dr;
  int Nr;
  RealType F0;
  RealType eta;
  RealType Fe;
  vector<double,_std::allocator<double>_> F;
  vector<double,_std::allocator<double>_> Fn;
  RealType lambda;
  RealType kappa;
  RealType beta;
  RealType alpha;
  RealType B;
  RealType A;
  RealType rhoe;
  RealType fe;
  RealType re;
  EAMType et;
  EAMAtomData eamAtomData;
  EAMAdapter ea;
  AtomType *in_stack_fffffffffffff438;
  EAMAtomData *in_stack_fffffffffffff440;
  value_type_conflict *in_stack_fffffffffffff448;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffff450;
  CubicSpline *this_03;
  value_type_conflict2 *in_stack_fffffffffffff458;
  EAM *in_stack_fffffffffffff460;
  vector<OpenMD::EAMInteractionData,_std::allocator<OpenMD::EAMInteractionData>_> *this_04;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffff468;
  CubicSpline *in_stack_fffffffffffff470;
  undefined4 in_stack_fffffffffffff478;
  undefined4 in_stack_fffffffffffff47c;
  value_type vVar12;
  RealType in_stack_fffffffffffff480;
  errorStruct *peVar13;
  undefined4 in_stack_fffffffffffff488;
  undefined4 in_stack_fffffffffffff48c;
  int ident;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffff490;
  undefined4 in_stack_fffffffffffff498;
  undefined4 in_stack_fffffffffffff49c;
  undefined6 in_stack_fffffffffffff4b0;
  undefined1 in_stack_fffffffffffff4b6;
  EAMAdapter *in_stack_fffffffffffff4c0;
  RealType in_stack_fffffffffffff4d0;
  RealType in_stack_fffffffffffff4d8;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffff4e0;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffff4e8;
  RealType in_stack_fffffffffffff4f0;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffff4f8;
  EAM *in_stack_fffffffffffff500;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffff508;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffff510;
  RealType in_stack_fffffffffffff518;
  EAM *in_stack_fffffffffffff520;
  RealType in_stack_fffffffffffff528;
  EAM *in_stack_fffffffffffff530;
  EAMAdapter *in_stack_fffffffffffff550;
  EAMAdapter *in_stack_fffffffffffff568;
  RealType in_stack_fffffffffffff598;
  EAM *in_stack_fffffffffffff5a0;
  undefined1 local_808 [104];
  _Base_ptr local_7a0;
  undefined1 local_798;
  pair<std::_Rb_tree_const_iterator<int>,_bool> local_790;
  pair<std::_Rb_tree_const_iterator<int>,_bool> local_780;
  value_type local_770;
  uint local_76c;
  FluctuatingChargeAdapter in_stack_fffffffffffff898;
  AtomType *in_stack_fffffffffffff8a0;
  EAM *in_stack_fffffffffffff8a8;
  int local_6dc;
  int local_69c;
  RealType local_5e8;
  double local_5e0;
  double local_5d8;
  int local_5cc;
  double local_5c8;
  double local_5c0;
  double local_5b8;
  double local_5b0;
  double local_5a8;
  int local_59c;
  RealType local_550;
  EAMAdapter *local_548;
  RealType local_540;
  RealType local_538;
  EAMAdapter *local_530;
  RealType local_528;
  RealType local_520;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  *local_518;
  vector<double,_std::allocator<double>_> *local_510;
  vector<double,_std::allocator<double>_> *local_508;
  RealType local_4c0;
  int local_4b4;
  RealType local_438;
  RealType local_430;
  double local_428;
  double local_420;
  double local_418;
  double local_410;
  double local_408;
  int local_3fc;
  RealType local_3f8;
  RealType local_3f0;
  RealType local_3e8;
  RealType local_3e0;
  RealType local_3d8;
  RealType local_3d0;
  RealType local_3c8;
  RealType local_3c0;
  RealType local_3a8;
  int local_39c;
  RealType local_368;
  int local_35c;
  RealType local_358;
  RealType local_350;
  RealType local_348;
  RealType local_310;
  int local_304;
  RealType local_300;
  RealType local_2f8;
  RealType local_2f0;
  RealType local_2b8;
  int local_2ac;
  RealType local_278;
  int local_26c;
  RealType local_1d8;
  RealType local_1d0;
  double local_1c8;
  double local_1c0;
  RealType local_1b8;
  double local_1b0;
  double local_1a8;
  double local_1a0;
  int local_194;
  double local_190;
  double local_188;
  double local_180;
  double local_178;
  double local_170;
  int local_164;
  RealType local_160;
  RealType local_158;
  RealType local_150;
  RealType local_118;
  RealType local_110;
  RealType local_108;
  RealType local_100;
  RealType local_f8;
  RealType local_f0;
  RealType local_e8;
  RealType local_e0;
  RealType local_d8;
  EAMType local_8c;
  double local_38;
  RealType local_30;
  RealType local_28;
  undefined1 local_20;
  EAMAdapter local_18;
  AtomType *local_10;
  
  local_10 = in_RSI;
  EAMAdapter::EAMAdapter(&local_18,in_RSI);
  EAMAtomData::EAMAtomData(in_stack_fffffffffffff440);
  local_8c = EAMAdapter::getEAMType((EAMAdapter *)in_stack_fffffffffffff470);
  switch(local_8c) {
  case eamFuncfl:
    EAMAdapter::getRhoSpline((EAMAdapter *)in_stack_fffffffffffff508);
    std::shared_ptr<OpenMD::CubicSpline>::operator=
              (&in_stack_fffffffffffff440->rho,
               (shared_ptr<OpenMD::CubicSpline> *)in_stack_fffffffffffff438);
    std::shared_ptr<OpenMD::CubicSpline>::~shared_ptr((shared_ptr<OpenMD::CubicSpline> *)0x3a1dc0);
    EAMAdapter::getFSpline((EAMAdapter *)in_stack_fffffffffffff508);
    std::shared_ptr<OpenMD::CubicSpline>::operator=
              (&in_stack_fffffffffffff440->rho,
               (shared_ptr<OpenMD::CubicSpline> *)in_stack_fffffffffffff438);
    std::shared_ptr<OpenMD::CubicSpline>::~shared_ptr((shared_ptr<OpenMD::CubicSpline> *)0x3a1e01);
    EAMAdapter::getZSpline((EAMAdapter *)in_stack_fffffffffffff508);
    std::shared_ptr<OpenMD::CubicSpline>::operator=
              (&in_stack_fffffffffffff440->rho,
               (shared_ptr<OpenMD::CubicSpline> *)in_stack_fffffffffffff438);
    std::shared_ptr<OpenMD::CubicSpline>::~shared_ptr((shared_ptr<OpenMD::CubicSpline> *)0x3a1e42);
    local_38 = EAMAdapter::getRcut(in_stack_fffffffffffff4c0);
    break;
  case eamZhou2001:
  case eamZhou2004:
  case eamZhou2005:
  case eamZhouRose:
    local_d8 = EAMAdapter::getRe(in_stack_fffffffffffff550);
    local_e0 = EAMAdapter::get_fe(in_stack_fffffffffffff550);
    local_e8 = EAMAdapter::getRhoe(in_stack_fffffffffffff550);
    local_f0 = EAMAdapter::getA(in_stack_fffffffffffff550);
    local_f8 = EAMAdapter::getB(in_stack_fffffffffffff550);
    local_100 = EAMAdapter::getAlpha(in_stack_fffffffffffff550);
    local_108 = EAMAdapter::getBeta(in_stack_fffffffffffff550);
    local_110 = EAMAdapter::getKappa(in_stack_fffffffffffff550);
    local_118 = EAMAdapter::getLambda(in_stack_fffffffffffff550);
    EAMAdapter::getFn(in_stack_fffffffffffff568);
    EAMAdapter::getF(in_stack_fffffffffffff568);
    local_150 = EAMAdapter::getFe(in_stack_fffffffffffff550);
    local_158 = EAMAdapter::getEta(in_stack_fffffffffffff550);
    local_160 = EAMAdapter::getF0(in_stack_fffffffffffff550);
    local_164 = 2000;
    local_170 = 12.0;
    local_178 = 9.0;
    local_180 = local_d8 * 4.0;
    pdVar4 = std::max<double>(&local_178,&local_180);
    pdVar4 = std::min<double>(&local_170,pdVar4);
    local_38 = *pdVar4;
    local_188 = local_38 / (double)(local_164 + -1);
    local_194 = 3000;
    local_1a8 = 900.0;
    local_1b0 = local_e8 + local_e8;
    local_1b8 = Rho((EAM *)CONCAT44(in_stack_fffffffffffff47c,in_stack_fffffffffffff478),
                    (RealType)in_stack_fffffffffffff470,(RealType)in_stack_fffffffffffff468,
                    (RealType)in_stack_fffffffffffff460,(RealType)in_stack_fffffffffffff458,
                    (RealType)in_stack_fffffffffffff450);
    pdVar4 = std::max<double>(&local_1b0,&local_1b8);
    pdVar4 = std::max<double>(&local_1a8,pdVar4);
    local_1a0 = *pdVar4;
    local_1c0 = local_1a0 / (double)(local_194 + -1);
    std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)0x3a2262);
    std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)0x3a226f);
    std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)0x3a227c);
    std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)0x3a2289);
    std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)0x3a2296);
    std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)0x3a22a3);
    for (local_26c = 0; local_26c < local_164; local_26c = local_26c + 1) {
      local_190 = (double)local_26c * local_188;
      std::vector<double,_std::allocator<double>_>::push_back
                (in_stack_fffffffffffff450,in_stack_fffffffffffff448);
      local_278 = Rho((EAM *)CONCAT44(in_stack_fffffffffffff47c,in_stack_fffffffffffff478),
                      (RealType)in_stack_fffffffffffff470,(RealType)in_stack_fffffffffffff468,
                      (RealType)in_stack_fffffffffffff460,(RealType)in_stack_fffffffffffff458,
                      (RealType)in_stack_fffffffffffff450);
      std::vector<double,_std::allocator<double>_>::push_back
                ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffff440,
                 (value_type_conflict *)in_stack_fffffffffffff438);
      local_1d0 = PhiCoreCore((EAM *)CONCAT44(in_stack_fffffffffffff49c,in_stack_fffffffffffff498),
                              (RealType)in_stack_fffffffffffff490,
                              (RealType)
                              CONCAT44(in_stack_fffffffffffff48c,in_stack_fffffffffffff488),
                              in_stack_fffffffffffff480,
                              (RealType)
                              CONCAT44(in_stack_fffffffffffff47c,in_stack_fffffffffffff478),
                              (RealType)in_stack_fffffffffffff470);
      local_1d8 = PhiCoreValence((EAM *)CONCAT44(in_stack_fffffffffffff47c,in_stack_fffffffffffff478
                                                ),(RealType)in_stack_fffffffffffff470,
                                 (RealType)in_stack_fffffffffffff468,
                                 (RealType)in_stack_fffffffffffff460,
                                 (RealType)in_stack_fffffffffffff458,
                                 (RealType)in_stack_fffffffffffff450);
      std::vector<double,_std::allocator<double>_>::push_back
                (in_stack_fffffffffffff450,in_stack_fffffffffffff448);
      std::vector<double,_std::allocator<double>_>::push_back
                (in_stack_fffffffffffff450,in_stack_fffffffffffff448);
    }
    std::make_shared<OpenMD::CubicSpline>();
    std::shared_ptr<OpenMD::CubicSpline>::operator=
              (&in_stack_fffffffffffff440->rho,
               (shared_ptr<OpenMD::CubicSpline> *)in_stack_fffffffffffff438);
    std::shared_ptr<OpenMD::CubicSpline>::~shared_ptr((shared_ptr<OpenMD::CubicSpline> *)0x3a24e6);
    std::__shared_ptr_access<OpenMD::CubicSpline,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<OpenMD::CubicSpline,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
               )0x3a24f3);
    CubicSpline::addPoints
              (in_stack_fffffffffffff470,in_stack_fffffffffffff468,
               (vector<double,_std::allocator<double>_> *)in_stack_fffffffffffff460);
    std::make_shared<OpenMD::CubicSpline>();
    std::shared_ptr<OpenMD::CubicSpline>::operator=
              (&in_stack_fffffffffffff440->rho,
               (shared_ptr<OpenMD::CubicSpline> *)in_stack_fffffffffffff438);
    std::shared_ptr<OpenMD::CubicSpline>::~shared_ptr((shared_ptr<OpenMD::CubicSpline> *)0x3a254e);
    std::__shared_ptr_access<OpenMD::CubicSpline,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<OpenMD::CubicSpline,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
               )0x3a255b);
    CubicSpline::addPoints
              (in_stack_fffffffffffff470,in_stack_fffffffffffff468,
               (vector<double,_std::allocator<double>_> *)in_stack_fffffffffffff460);
    std::make_shared<OpenMD::CubicSpline>();
    std::shared_ptr<OpenMD::CubicSpline>::operator=
              (&in_stack_fffffffffffff440->rho,
               (shared_ptr<OpenMD::CubicSpline> *)in_stack_fffffffffffff438);
    std::shared_ptr<OpenMD::CubicSpline>::~shared_ptr((shared_ptr<OpenMD::CubicSpline> *)0x3a25b6);
    std::__shared_ptr_access<OpenMD::CubicSpline,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<OpenMD::CubicSpline,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
               )0x3a25c3);
    CubicSpline::addPoints
              (in_stack_fffffffffffff470,in_stack_fffffffffffff468,
               (vector<double,_std::allocator<double>_> *)in_stack_fffffffffffff460);
    std::vector<double,_std::allocator<double>_>::clear
              ((vector<double,_std::allocator<double>_> *)0x3a25ea);
    if (local_8c == eamZhou2001) {
      for (local_2ac = 0; local_2ac < local_194; local_2ac = local_2ac + 1) {
        local_1c8 = (double)local_2ac * local_1c0;
        std::vector<double,_std::allocator<double>_>::push_back
                  (in_stack_fffffffffffff450,in_stack_fffffffffffff448);
        std::vector<double,_std::allocator<double>_>::vector
                  (in_stack_fffffffffffff490,
                   (vector<double,_std::allocator<double>_> *)
                   CONCAT44(in_stack_fffffffffffff48c,in_stack_fffffffffffff488));
        std::vector<double,_std::allocator<double>_>::vector
                  (in_stack_fffffffffffff490,
                   (vector<double,_std::allocator<double>_> *)
                   CONCAT44(in_stack_fffffffffffff48c,in_stack_fffffffffffff488));
        local_2b8 = Zhou2001Functional(in_stack_fffffffffffff500,(RealType)in_stack_fffffffffffff4f8
                                       ,in_stack_fffffffffffff4f0,in_stack_fffffffffffff4e8,
                                       in_stack_fffffffffffff4e0,in_stack_fffffffffffff4d8,
                                       in_stack_fffffffffffff4d0);
        std::vector<double,_std::allocator<double>_>::push_back
                  ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffff440,
                   (value_type_conflict *)in_stack_fffffffffffff438);
        std::vector<double,_std::allocator<double>_>::~vector(in_stack_fffffffffffff450);
        std::vector<double,_std::allocator<double>_>::~vector(in_stack_fffffffffffff450);
      }
    }
    else if (local_8c == eamZhou2004) {
      local_2f0 = EAMAdapter::getRhos(in_stack_fffffffffffff550);
      local_2f8 = EAMAdapter::getRhol(in_stack_fffffffffffff550);
      local_300 = EAMAdapter::getRhoh(in_stack_fffffffffffff550);
      for (local_304 = 0; local_304 < local_194; local_304 = local_304 + 1) {
        local_1c8 = (double)local_304 * local_1c0;
        std::vector<double,_std::allocator<double>_>::push_back
                  (in_stack_fffffffffffff450,in_stack_fffffffffffff448);
        std::vector<double,_std::allocator<double>_>::vector
                  (in_stack_fffffffffffff490,
                   (vector<double,_std::allocator<double>_> *)
                   CONCAT44(in_stack_fffffffffffff48c,in_stack_fffffffffffff488));
        std::vector<double,_std::allocator<double>_>::vector
                  (in_stack_fffffffffffff490,
                   (vector<double,_std::allocator<double>_> *)
                   CONCAT44(in_stack_fffffffffffff48c,in_stack_fffffffffffff488));
        local_310 = Zhou2004Functional(in_stack_fffffffffffff520,in_stack_fffffffffffff518,
                                       (RealType)in_stack_fffffffffffff510,
                                       (RealType)in_stack_fffffffffffff508,
                                       (vector<double,_std::allocator<double>_> *)
                                       in_stack_fffffffffffff500,in_stack_fffffffffffff4f8,
                                       in_stack_fffffffffffff4f0,(RealType)in_stack_fffffffffffff4e8
                                       ,(RealType)in_stack_fffffffffffff4e0,
                                       in_stack_fffffffffffff4d8);
        std::vector<double,_std::allocator<double>_>::push_back
                  ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffff440,
                   (value_type_conflict *)in_stack_fffffffffffff438);
        std::vector<double,_std::allocator<double>_>::~vector(in_stack_fffffffffffff450);
        std::vector<double,_std::allocator<double>_>::~vector(in_stack_fffffffffffff450);
      }
    }
    else if (local_8c == eamZhou2005) {
      local_348 = EAMAdapter::getRhos(in_stack_fffffffffffff550);
      local_350 = EAMAdapter::getF3plus(in_stack_fffffffffffff550);
      local_358 = EAMAdapter::getF3minus(in_stack_fffffffffffff550);
      for (local_35c = 0; local_35c < local_194; local_35c = local_35c + 1) {
        local_1c8 = (double)local_35c * local_1c0;
        std::vector<double,_std::allocator<double>_>::push_back
                  (in_stack_fffffffffffff450,in_stack_fffffffffffff448);
        std::vector<double,_std::allocator<double>_>::vector
                  (in_stack_fffffffffffff490,
                   (vector<double,_std::allocator<double>_> *)
                   CONCAT44(in_stack_fffffffffffff48c,in_stack_fffffffffffff488));
        std::vector<double,_std::allocator<double>_>::vector
                  (in_stack_fffffffffffff490,
                   (vector<double,_std::allocator<double>_> *)
                   CONCAT44(in_stack_fffffffffffff48c,in_stack_fffffffffffff488));
        local_368 = Zhou2005Functional(in_stack_fffffffffffff530,in_stack_fffffffffffff528,
                                       (RealType)in_stack_fffffffffffff520,in_stack_fffffffffffff518
                                       ,in_stack_fffffffffffff510,in_stack_fffffffffffff508,
                                       (RealType)in_stack_fffffffffffff500,
                                       (RealType)in_stack_fffffffffffff4f8,in_stack_fffffffffffff4f0
                                       ,(RealType)in_stack_fffffffffffff4e8);
        std::vector<double,_std::allocator<double>_>::push_back
                  ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffff440,
                   (value_type_conflict *)in_stack_fffffffffffff438);
        std::vector<double,_std::allocator<double>_>::~vector(in_stack_fffffffffffff450);
        std::vector<double,_std::allocator<double>_>::~vector(in_stack_fffffffffffff450);
      }
    }
    else if (local_8c == eamZhouRose) {
      for (local_39c = 0; local_39c < local_194; local_39c = local_39c + 1) {
        local_1c8 = (double)local_39c * local_1c0;
        std::vector<double,_std::allocator<double>_>::push_back
                  (in_stack_fffffffffffff450,in_stack_fffffffffffff448);
        local_3a8 = RoseFunctional(in_stack_fffffffffffff460,(RealType)in_stack_fffffffffffff458,
                                   (RealType)in_stack_fffffffffffff450,
                                   (RealType)in_stack_fffffffffffff448);
        std::vector<double,_std::allocator<double>_>::push_back
                  ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffff440,
                   (value_type_conflict *)in_stack_fffffffffffff438);
      }
    }
    std::make_shared<OpenMD::CubicSpline>();
    std::shared_ptr<OpenMD::CubicSpline>::operator=
              (&in_stack_fffffffffffff440->rho,
               (shared_ptr<OpenMD::CubicSpline> *)in_stack_fffffffffffff438);
    std::shared_ptr<OpenMD::CubicSpline>::~shared_ptr((shared_ptr<OpenMD::CubicSpline> *)0x3a2d44);
    std::__shared_ptr_access<OpenMD::CubicSpline,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<OpenMD::CubicSpline,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
               )0x3a2d51);
    CubicSpline::addPoints
              (in_stack_fffffffffffff470,in_stack_fffffffffffff468,
               (vector<double,_std::allocator<double>_> *)in_stack_fffffffffffff460);
    std::vector<double,_std::allocator<double>_>::~vector(in_stack_fffffffffffff450);
    std::vector<double,_std::allocator<double>_>::~vector(in_stack_fffffffffffff450);
    std::vector<double,_std::allocator<double>_>::~vector(in_stack_fffffffffffff450);
    std::vector<double,_std::allocator<double>_>::~vector(in_stack_fffffffffffff450);
    std::vector<double,_std::allocator<double>_>::~vector(in_stack_fffffffffffff450);
    std::vector<double,_std::allocator<double>_>::~vector(in_stack_fffffffffffff450);
    std::vector<double,_std::allocator<double>_>::~vector(in_stack_fffffffffffff450);
    std::vector<double,_std::allocator<double>_>::~vector(in_stack_fffffffffffff450);
    break;
  case eamZhou2005Oxygen:
    OrhoLimits_00 =
         (vector<double,_std::allocator<double>_> *)EAMAdapter::getRe(in_stack_fffffffffffff550);
    local_508 = OrhoLimits_00;
    OrhoE_00 = (vector<double,_std::allocator<double>_> *)
               EAMAdapter::get_fe(in_stack_fffffffffffff550);
    local_510 = OrhoE_00;
    OF_00 = (vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             *)EAMAdapter::getA(in_stack_fffffffffffff550);
    local_518 = OF_00;
    local_520 = EAMAdapter::getB(in_stack_fffffffffffff550);
    local_528 = EAMAdapter::getAlpha(in_stack_fffffffffffff550);
    this_02 = (EAMAdapter *)EAMAdapter::getBeta(in_stack_fffffffffffff550);
    local_530 = this_02;
    local_538 = EAMAdapter::getKappa(in_stack_fffffffffffff550);
    local_540 = EAMAdapter::getLambda(in_stack_fffffffffffff550);
    local_548 = (EAMAdapter *)EAMAdapter::getGamma(in_stack_fffffffffffff550);
    local_550 = EAMAdapter::getNu(local_548);
    EAMAdapter::getOrhoLimits(this_02);
    EAMAdapter::getOrhoE(this_02);
    EAMAdapter::getOF(this_02);
    local_59c = 2000;
    local_5a8 = 12.0;
    local_5b0 = 9.0;
    local_5b8 = (double)local_508 * 4.0;
    pdVar4 = std::max<double>(&local_5b0,&local_5b8);
    pdVar4 = std::min<double>(&local_5a8,pdVar4);
    local_38 = *pdVar4;
    local_5c0 = local_38 / (double)(local_59c + -1);
    local_5cc = 3000;
    local_5e0 = 800.0;
    local_5e8 = Rho((EAM *)CONCAT44(in_stack_fffffffffffff47c,in_stack_fffffffffffff478),
                    (RealType)in_stack_fffffffffffff470,(RealType)in_stack_fffffffffffff468,
                    (RealType)in_stack_fffffffffffff460,(RealType)in_stack_fffffffffffff458,
                    (RealType)in_stack_fffffffffffff450);
    pdVar4 = std::max<double>(&local_5e0,&local_5e8);
    local_5d8 = *pdVar4;
    std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)0x3a37e5);
    std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)0x3a37f2);
    std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)0x3a37ff);
    std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)0x3a380c);
    std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)0x3a3819);
    std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)0x3a3826);
    for (local_69c = 0; local_69c < local_59c; local_69c = local_69c + 1) {
      local_5c8 = (double)local_69c * local_5c0;
      std::vector<double,_std::allocator<double>_>::push_back
                (in_stack_fffffffffffff450,in_stack_fffffffffffff448);
      Rho((EAM *)CONCAT44(in_stack_fffffffffffff47c,in_stack_fffffffffffff478),
          (RealType)in_stack_fffffffffffff470,(RealType)in_stack_fffffffffffff468,
          (RealType)in_stack_fffffffffffff460,(RealType)in_stack_fffffffffffff458,
          (RealType)in_stack_fffffffffffff450);
      std::vector<double,_std::allocator<double>_>::push_back
                ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffff440,
                 (value_type_conflict *)in_stack_fffffffffffff438);
      PhiCoreCore((EAM *)CONCAT44(in_stack_fffffffffffff49c,in_stack_fffffffffffff498),
                  (RealType)in_stack_fffffffffffff490,
                  (RealType)CONCAT44(in_stack_fffffffffffff48c,in_stack_fffffffffffff488),
                  in_stack_fffffffffffff480,
                  (RealType)CONCAT44(in_stack_fffffffffffff47c,in_stack_fffffffffffff478),
                  (RealType)in_stack_fffffffffffff470);
      PhiCoreValence((EAM *)CONCAT44(in_stack_fffffffffffff47c,in_stack_fffffffffffff478),
                     (RealType)in_stack_fffffffffffff470,(RealType)in_stack_fffffffffffff468,
                     (RealType)in_stack_fffffffffffff460,(RealType)in_stack_fffffffffffff458,
                     (RealType)in_stack_fffffffffffff450);
      std::vector<double,_std::allocator<double>_>::push_back
                (in_stack_fffffffffffff450,in_stack_fffffffffffff448);
      std::vector<double,_std::allocator<double>_>::push_back
                (in_stack_fffffffffffff450,in_stack_fffffffffffff448);
    }
    std::make_shared<OpenMD::CubicSpline>();
    std::shared_ptr<OpenMD::CubicSpline>::operator=
              (&in_stack_fffffffffffff440->rho,
               (shared_ptr<OpenMD::CubicSpline> *)in_stack_fffffffffffff438);
    std::shared_ptr<OpenMD::CubicSpline>::~shared_ptr((shared_ptr<OpenMD::CubicSpline> *)0x3a3a82);
    std::__shared_ptr_access<OpenMD::CubicSpline,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<OpenMD::CubicSpline,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
               )0x3a3a8f);
    CubicSpline::addPoints
              (in_stack_fffffffffffff470,in_stack_fffffffffffff468,
               (vector<double,_std::allocator<double>_> *)in_stack_fffffffffffff460);
    std::make_shared<OpenMD::CubicSpline>();
    std::shared_ptr<OpenMD::CubicSpline>::operator=
              (&in_stack_fffffffffffff440->rho,
               (shared_ptr<OpenMD::CubicSpline> *)in_stack_fffffffffffff438);
    std::shared_ptr<OpenMD::CubicSpline>::~shared_ptr((shared_ptr<OpenMD::CubicSpline> *)0x3a3aea);
    std::__shared_ptr_access<OpenMD::CubicSpline,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<OpenMD::CubicSpline,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
               )0x3a3af7);
    CubicSpline::addPoints
              (in_stack_fffffffffffff470,in_stack_fffffffffffff468,
               (vector<double,_std::allocator<double>_> *)in_stack_fffffffffffff460);
    std::make_shared<OpenMD::CubicSpline>();
    std::shared_ptr<OpenMD::CubicSpline>::operator=
              (&in_stack_fffffffffffff440->rho,
               (shared_ptr<OpenMD::CubicSpline> *)in_stack_fffffffffffff438);
    std::shared_ptr<OpenMD::CubicSpline>::~shared_ptr((shared_ptr<OpenMD::CubicSpline> *)0x3a3b52);
    std::__shared_ptr_access<OpenMD::CubicSpline,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<OpenMD::CubicSpline,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
               )0x3a3b5f);
    CubicSpline::addPoints
              (in_stack_fffffffffffff470,in_stack_fffffffffffff468,
               (vector<double,_std::allocator<double>_> *)in_stack_fffffffffffff460);
    std::vector<double,_std::allocator<double>_>::clear
              ((vector<double,_std::allocator<double>_> *)0x3a3b86);
    for (local_6dc = 0; local_6dc < local_5cc; local_6dc = local_6dc + 1) {
      std::vector<double,_std::allocator<double>_>::push_back
                (in_stack_fffffffffffff450,in_stack_fffffffffffff448);
      std::vector<double,_std::allocator<double>_>::vector
                (in_stack_fffffffffffff490,
                 (vector<double,_std::allocator<double>_> *)
                 CONCAT44(in_stack_fffffffffffff48c,in_stack_fffffffffffff488));
      std::vector<double,_std::allocator<double>_>::vector
                (in_stack_fffffffffffff490,
                 (vector<double,_std::allocator<double>_> *)
                 CONCAT44(in_stack_fffffffffffff48c,in_stack_fffffffffffff488));
      std::
      vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ::vector((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                *)in_stack_fffffffffffff490,
               (vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                *)CONCAT44(in_stack_fffffffffffff48c,in_stack_fffffffffffff488));
      Zhou2005OxygenFunctional
                (in_stack_fffffffffffff5a0,in_stack_fffffffffffff598,OrhoLimits_00,OrhoE_00,OF_00);
      std::vector<double,_std::allocator<double>_>::push_back
                ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffff440,
                 (value_type_conflict *)in_stack_fffffffffffff438);
      std::
      vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ::~vector((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 *)in_stack_fffffffffffff450);
      std::vector<double,_std::allocator<double>_>::~vector(in_stack_fffffffffffff450);
      std::vector<double,_std::allocator<double>_>::~vector(in_stack_fffffffffffff450);
    }
    std::make_shared<OpenMD::CubicSpline>();
    std::shared_ptr<OpenMD::CubicSpline>::operator=
              (&in_stack_fffffffffffff440->rho,
               (shared_ptr<OpenMD::CubicSpline> *)in_stack_fffffffffffff438);
    std::shared_ptr<OpenMD::CubicSpline>::~shared_ptr((shared_ptr<OpenMD::CubicSpline> *)0x3a3d6a);
    std::__shared_ptr_access<OpenMD::CubicSpline,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<OpenMD::CubicSpline,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
               )0x3a3d77);
    CubicSpline::addPoints
              (in_stack_fffffffffffff470,in_stack_fffffffffffff468,
               (vector<double,_std::allocator<double>_> *)in_stack_fffffffffffff460);
    std::vector<double,_std::allocator<double>_>::~vector(in_stack_fffffffffffff450);
    std::vector<double,_std::allocator<double>_>::~vector(in_stack_fffffffffffff450);
    std::vector<double,_std::allocator<double>_>::~vector(in_stack_fffffffffffff450);
    std::vector<double,_std::allocator<double>_>::~vector(in_stack_fffffffffffff450);
    std::vector<double,_std::allocator<double>_>::~vector(in_stack_fffffffffffff450);
    std::vector<double,_std::allocator<double>_>::~vector(in_stack_fffffffffffff450);
    std::
    vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ::~vector((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               *)in_stack_fffffffffffff450);
    std::vector<double,_std::allocator<double>_>::~vector(in_stack_fffffffffffff450);
    std::vector<double,_std::allocator<double>_>::~vector(in_stack_fffffffffffff450);
    break;
  case eamOxygenFuncfl:
    local_3c0 = EAMAdapter::getRe(in_stack_fffffffffffff550);
    local_3c8 = EAMAdapter::get_fe(in_stack_fffffffffffff550);
    local_3d0 = EAMAdapter::getA(in_stack_fffffffffffff550);
    local_3d8 = EAMAdapter::getB(in_stack_fffffffffffff550);
    local_3e0 = EAMAdapter::getAlpha(in_stack_fffffffffffff550);
    local_3e8 = EAMAdapter::getBeta(in_stack_fffffffffffff550);
    local_3f0 = EAMAdapter::getKappa(in_stack_fffffffffffff550);
    local_3f8 = EAMAdapter::getLambda(in_stack_fffffffffffff550);
    local_3fc = 2000;
    local_408 = 12.0;
    local_410 = 9.0;
    local_418 = local_3c0 * 4.0;
    pdVar4 = std::max<double>(&local_410,&local_418);
    pdVar4 = std::min<double>(&local_408,pdVar4);
    local_38 = *pdVar4;
    local_420 = local_38 / (double)(local_3fc + -1);
    std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)0x3a3066);
    std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)0x3a3073);
    std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)0x3a3080);
    std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)0x3a308d);
    std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)0x3a309a);
    for (local_4b4 = 0; local_4b4 < local_3fc; local_4b4 = local_4b4 + 1) {
      local_428 = (double)local_4b4 * local_420;
      std::vector<double,_std::allocator<double>_>::push_back
                (in_stack_fffffffffffff450,in_stack_fffffffffffff448);
      local_4c0 = Rho((EAM *)CONCAT44(in_stack_fffffffffffff47c,in_stack_fffffffffffff478),
                      (RealType)in_stack_fffffffffffff470,(RealType)in_stack_fffffffffffff468,
                      (RealType)in_stack_fffffffffffff460,(RealType)in_stack_fffffffffffff458,
                      (RealType)in_stack_fffffffffffff450);
      std::vector<double,_std::allocator<double>_>::push_back
                ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffff440,
                 (value_type_conflict *)in_stack_fffffffffffff438);
      local_430 = PhiCoreCore((EAM *)CONCAT44(in_stack_fffffffffffff49c,in_stack_fffffffffffff498),
                              (RealType)in_stack_fffffffffffff490,
                              (RealType)
                              CONCAT44(in_stack_fffffffffffff48c,in_stack_fffffffffffff488),
                              in_stack_fffffffffffff480,
                              (RealType)
                              CONCAT44(in_stack_fffffffffffff47c,in_stack_fffffffffffff478),
                              (RealType)in_stack_fffffffffffff470);
      local_438 = PhiCoreValence((EAM *)CONCAT44(in_stack_fffffffffffff47c,in_stack_fffffffffffff478
                                                ),(RealType)in_stack_fffffffffffff470,
                                 (RealType)in_stack_fffffffffffff468,
                                 (RealType)in_stack_fffffffffffff460,
                                 (RealType)in_stack_fffffffffffff458,
                                 (RealType)in_stack_fffffffffffff450);
      std::vector<double,_std::allocator<double>_>::push_back
                (in_stack_fffffffffffff450,in_stack_fffffffffffff448);
      std::vector<double,_std::allocator<double>_>::push_back
                (in_stack_fffffffffffff450,in_stack_fffffffffffff448);
    }
    std::make_shared<OpenMD::CubicSpline>();
    std::shared_ptr<OpenMD::CubicSpline>::operator=
              (&in_stack_fffffffffffff440->rho,
               (shared_ptr<OpenMD::CubicSpline> *)in_stack_fffffffffffff438);
    std::shared_ptr<OpenMD::CubicSpline>::~shared_ptr((shared_ptr<OpenMD::CubicSpline> *)0x3a32ec);
    std::__shared_ptr_access<OpenMD::CubicSpline,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<OpenMD::CubicSpline,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
               )0x3a32f9);
    CubicSpline::addPoints
              (in_stack_fffffffffffff470,in_stack_fffffffffffff468,
               (vector<double,_std::allocator<double>_> *)in_stack_fffffffffffff460);
    std::make_shared<OpenMD::CubicSpline>();
    std::shared_ptr<OpenMD::CubicSpline>::operator=
              (&in_stack_fffffffffffff440->rho,
               (shared_ptr<OpenMD::CubicSpline> *)in_stack_fffffffffffff438);
    std::shared_ptr<OpenMD::CubicSpline>::~shared_ptr((shared_ptr<OpenMD::CubicSpline> *)0x3a3354);
    std::__shared_ptr_access<OpenMD::CubicSpline,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<OpenMD::CubicSpline,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
               )0x3a3361);
    CubicSpline::addPoints
              (in_stack_fffffffffffff470,in_stack_fffffffffffff468,
               (vector<double,_std::allocator<double>_> *)in_stack_fffffffffffff460);
    std::make_shared<OpenMD::CubicSpline>();
    std::shared_ptr<OpenMD::CubicSpline>::operator=
              (&in_stack_fffffffffffff440->rho,
               (shared_ptr<OpenMD::CubicSpline> *)in_stack_fffffffffffff438);
    std::shared_ptr<OpenMD::CubicSpline>::~shared_ptr((shared_ptr<OpenMD::CubicSpline> *)0x3a33bc);
    std::__shared_ptr_access<OpenMD::CubicSpline,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<OpenMD::CubicSpline,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
               )0x3a33c9);
    CubicSpline::addPoints
              (in_stack_fffffffffffff470,in_stack_fffffffffffff468,
               (vector<double,_std::allocator<double>_> *)in_stack_fffffffffffff460);
    EAMAdapter::getFSpline((EAMAdapter *)in_stack_fffffffffffff508);
    std::shared_ptr<OpenMD::CubicSpline>::operator=
              (&in_stack_fffffffffffff440->rho,
               (shared_ptr<OpenMD::CubicSpline> *)in_stack_fffffffffffff438);
    std::shared_ptr<OpenMD::CubicSpline>::~shared_ptr((shared_ptr<OpenMD::CubicSpline> *)0x3a3420);
    std::vector<double,_std::allocator<double>_>::~vector(in_stack_fffffffffffff450);
    std::vector<double,_std::allocator<double>_>::~vector(in_stack_fffffffffffff450);
    std::vector<double,_std::allocator<double>_>::~vector(in_stack_fffffffffffff450);
    std::vector<double,_std::allocator<double>_>::~vector(in_stack_fffffffffffff450);
    std::vector<double,_std::allocator<double>_>::~vector(in_stack_fffffffffffff450);
    break;
  case eamUnknown:
    AtomType::getName_abi_cxx11_(in_stack_fffffffffffff438);
    uVar5 = std::__cxx11::string::c_str();
    peVar13 = &painCave;
    snprintf(painCave.errMsg,2000,"EAM::addType found an unknown EAM type for atomType %s\n",uVar5);
    std::__cxx11::string::~string((string *)&stack0xfffffffffffff8a0);
    peVar13->severity = 1;
    peVar13->isFatal = 1;
    simError();
  }
  FluctuatingChargeAdapter::FluctuatingChargeAdapter
            ((FluctuatingChargeAdapter *)&stack0xfffffffffffff898,local_10);
  uVar1 = FluctuatingChargeAdapter::isFluctuatingCharge((FluctuatingChargeAdapter *)0x3a3f2c);
  if ((bool)uVar1) {
    uVar2 = FluctuatingChargeAdapter::isMetallic
                      ((FluctuatingChargeAdapter *)
                       CONCAT17(uVar1,CONCAT16(in_stack_fffffffffffff4b6,in_stack_fffffffffffff4b0))
                      );
    if ((bool)uVar2) {
      local_20 = 1;
      local_30 = FluctuatingChargeAdapter::getNValence
                           ((FluctuatingChargeAdapter *)
                            CONCAT17(uVar1,CONCAT16(uVar2,in_stack_fffffffffffff4b0)));
      local_28 = FluctuatingChargeAdapter::getNMobile
                           ((FluctuatingChargeAdapter *)
                            CONCAT17(uVar1,CONCAT16(uVar2,in_stack_fffffffffffff4b0)));
    }
    else {
      local_20 = 0;
    }
  }
  else {
    local_20 = 0;
  }
  local_76c = AtomType::getIdent(local_10);
  sVar6 = std::set<int,_std::less<int>,_std::allocator<int>_>::size
                    ((set<int,_std::less<int>,_std::allocator<int>_> *)0x3a3fec);
  local_770 = (value_type)sVar6;
  std::pair<std::_Rb_tree_const_iterator<int>,_bool>::
  pair<std::_Rb_tree_const_iterator<int>,_bool,_true>
            ((pair<std::_Rb_tree_const_iterator<int>,_bool> *)in_stack_fffffffffffff440);
  pVar10 = std::set<int,_std::less<int>,_std::allocator<int>_>::insert
                     ((set<int,_std::less<int>,_std::allocator<int>_> *)in_stack_fffffffffffff460,
                      in_stack_fffffffffffff458);
  this_00 = pVar10.first._M_node;
  local_798 = pVar10.second;
  ident = CONCAT13(local_798,(int3)in_stack_fffffffffffff48c);
  local_7a0 = this_00._M_node;
  local_790.first._M_node = this_00._M_node;
  local_790.second = (bool)local_798;
  std::pair<std::_Rb_tree_const_iterator<int>,_bool>::operator=(&local_780,&local_790);
  if ((local_780.second & 1U) == 0) {
    peVar13 = &painCave;
    snprintf(painCave.errMsg,2000,"EAM already had a previous entry with ident %d\n",
             (ulong)local_76c);
    peVar13->severity = 3;
    peVar13->isFatal = 0;
    simError();
  }
  vVar12 = local_770;
  pvVar7 = std::vector<int,_std::allocator<int>_>::operator[]
                     ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x40),(long)(int)local_76c);
  *pvVar7 = vVar12;
  std::vector<OpenMD::EAMAtomData,_std::allocator<OpenMD::EAMAtomData>_>::operator[]
            ((vector<OpenMD::EAMAtomData,_std::allocator<OpenMD::EAMAtomData>_> *)(in_RDI + 0x58),
             (long)local_770);
  EAMAtomData::operator=(in_stack_fffffffffffff440,(EAMAtomData *)in_stack_fffffffffffff438);
  std::
  vector<std::vector<OpenMD::EAMInteractionData,_std::allocator<OpenMD::EAMInteractionData>_>,_std::allocator<std::vector<OpenMD::EAMInteractionData,_std::allocator<OpenMD::EAMInteractionData>_>_>_>
  ::operator[]((vector<std::vector<OpenMD::EAMInteractionData,_std::allocator<OpenMD::EAMInteractionData>_>,_std::allocator<std::vector<OpenMD::EAMInteractionData,_std::allocator<OpenMD::EAMInteractionData>_>_>_>
                *)(in_RDI + 0x70),(long)local_770);
  std::vector<OpenMD::EAMInteractionData,_std::allocator<OpenMD::EAMInteractionData>_>::resize
            ((vector<OpenMD::EAMInteractionData,_std::allocator<OpenMD::EAMInteractionData>_> *)
             in_stack_fffffffffffff460,(size_type)in_stack_fffffffffffff458);
  std::_Rb_tree_const_iterator<int>::_Rb_tree_const_iterator
            ((_Rb_tree_const_iterator<int> *)(local_808 + 0x60));
  local_808._88_8_ =
       std::set<int,_std::less<int>,_std::allocator<int>_>::begin
                 ((set<int,_std::less<int>,_std::allocator<int>_> *)in_stack_fffffffffffff438);
  pVar11.second = (double)in_stack_fffffffffffff448;
  pVar11.first = (double)in_stack_fffffffffffff450;
  local_808._96_8_ = local_808._88_8_;
  while( true ) {
    local_808._80_8_ =
         std::set<int,_std::less<int>,_std::allocator<int>_>::end
                   ((set<int,_std::less<int>,_std::allocator<int>_> *)in_stack_fffffffffffff438);
    bVar3 = std::operator!=((_Self *)(local_808 + 0x60),(_Self *)(local_808 + 0x50));
    if (!bVar3) break;
    this_01 = (vector<int,_std::allocator<int>_> *)(in_RDI + 0x40);
    this_04 = (vector<OpenMD::EAMInteractionData,_std::allocator<OpenMD::EAMInteractionData>_> *)
              (local_808 + 0x60);
    piVar8 = std::_Rb_tree_const_iterator<int>::operator*
                       ((_Rb_tree_const_iterator<int> *)in_stack_fffffffffffff440);
    pvVar7 = std::vector<int,_std::allocator<int>_>::operator[](this_01,(long)*piVar8);
    local_808._76_4_ = *pvVar7;
    std::_Rb_tree_const_iterator<int>::operator*
              ((_Rb_tree_const_iterator<int> *)in_stack_fffffffffffff440);
    local_808._64_8_ = ForceField::getAtomType((ForceField *)this_00._M_node,ident);
    EAMInteractionData::EAMInteractionData((EAMInteractionData *)in_stack_fffffffffffff440);
    getPhi(in_stack_fffffffffffff8a8,in_stack_fffffffffffff8a0,in_stack_fffffffffffff898.at_);
    in_stack_fffffffffffff440 = (EAMAtomData *)local_808;
    in_stack_fffffffffffff438 = (AtomType *)&stack0xfffffffffffff7e8;
    std::shared_ptr<OpenMD::CubicSpline>::operator=
              ((shared_ptr<OpenMD::CubicSpline> *)in_stack_fffffffffffff440,
               (shared_ptr<OpenMD::CubicSpline> *)in_stack_fffffffffffff438);
    std::shared_ptr<OpenMD::CubicSpline>::~shared_ptr((shared_ptr<OpenMD::CubicSpline> *)0x3a4291);
    this_03 = (CubicSpline *)pVar11.first;
    std::__shared_ptr_access<OpenMD::CubicSpline,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<OpenMD::CubicSpline,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
               )0x3a429b);
    pVar11 = CubicSpline::getLimits(this_03);
    local_808._48_8_ = pVar11.second;
    local_808[0x38] = 0;
    std::
    vector<std::vector<OpenMD::EAMInteractionData,_std::allocator<OpenMD::EAMInteractionData>_>,_std::allocator<std::vector<OpenMD::EAMInteractionData,_std::allocator<OpenMD::EAMInteractionData>_>_>_>
    ::operator[]((vector<std::vector<OpenMD::EAMInteractionData,_std::allocator<OpenMD::EAMInteractionData>_>,_std::allocator<std::vector<OpenMD::EAMInteractionData,_std::allocator<OpenMD::EAMInteractionData>_>_>_>
                  *)(in_RDI + 0x70),(long)(int)local_808._76_4_);
    std::vector<OpenMD::EAMInteractionData,_std::allocator<OpenMD::EAMInteractionData>_>::resize
              (this_04,(size_type)this_01);
    pvVar9 = std::
             vector<std::vector<OpenMD::EAMInteractionData,_std::allocator<OpenMD::EAMInteractionData>_>,_std::allocator<std::vector<OpenMD::EAMInteractionData,_std::allocator<OpenMD::EAMInteractionData>_>_>_>
             ::operator[]((vector<std::vector<OpenMD::EAMInteractionData,_std::allocator<OpenMD::EAMInteractionData>_>,_std::allocator<std::vector<OpenMD::EAMInteractionData,_std::allocator<OpenMD::EAMInteractionData>_>_>_>
                           *)(in_RDI + 0x70),(long)local_770);
    std::vector<OpenMD::EAMInteractionData,_std::allocator<OpenMD::EAMInteractionData>_>::operator[]
              (pvVar9,(long)(int)local_808._76_4_);
    EAMInteractionData::operator=
              ((EAMInteractionData *)in_stack_fffffffffffff440,
               (EAMInteractionData *)in_stack_fffffffffffff438);
    if (local_808._76_4_ != local_770) {
      pvVar9 = std::
               vector<std::vector<OpenMD::EAMInteractionData,_std::allocator<OpenMD::EAMInteractionData>_>,_std::allocator<std::vector<OpenMD::EAMInteractionData,_std::allocator<OpenMD::EAMInteractionData>_>_>_>
               ::operator[]((vector<std::vector<OpenMD::EAMInteractionData,_std::allocator<OpenMD::EAMInteractionData>_>,_std::allocator<std::vector<OpenMD::EAMInteractionData,_std::allocator<OpenMD::EAMInteractionData>_>_>_>
                             *)(in_RDI + 0x70),(long)(int)local_808._76_4_);
      std::vector<OpenMD::EAMInteractionData,_std::allocator<OpenMD::EAMInteractionData>_>::
      operator[](pvVar9,(long)local_770);
      EAMInteractionData::operator=
                ((EAMInteractionData *)in_stack_fffffffffffff440,
                 (EAMInteractionData *)in_stack_fffffffffffff438);
    }
    EAMInteractionData::~EAMInteractionData((EAMInteractionData *)in_stack_fffffffffffff440);
    std::_Rb_tree_const_iterator<int>::operator++
              ((_Rb_tree_const_iterator<int> *)in_stack_fffffffffffff440);
  }
  EAMAtomData::~EAMAtomData(in_stack_fffffffffffff440);
  return;
}

Assistant:

void EAM::addType(AtomType* atomType) {
    EAMAdapter ea = EAMAdapter(atomType);
    EAMAtomData eamAtomData;
    EAMType et = ea.getEAMType();

    switch (et) {
    case eamFuncfl: {
      eamAtomData.rho  = ea.getRhoSpline();
      eamAtomData.F    = ea.getFSpline();
      eamAtomData.Z    = ea.getZSpline();
      eamAtomData.rcut = ea.getRcut();
      break;
    }
    case eamZhou2001:
    case eamZhou2004:
    case eamZhou2005:
    case eamZhouRose: {
      RealType re              = ea.getRe();
      RealType fe              = ea.get_fe();
      RealType rhoe            = ea.getRhoe();
      RealType A               = ea.getA();
      RealType B               = ea.getB();
      RealType alpha           = ea.getAlpha();
      RealType beta            = ea.getBeta();
      RealType kappa           = ea.getKappa();
      RealType lambda          = ea.getLambda();
      std::vector<RealType> Fn = ea.getFn();
      std::vector<RealType> F  = ea.getF();
      RealType Fe              = ea.getFe();
      RealType eta             = ea.getEta();
      RealType F0              = ea.getF0();
      // RealType latticeConstant = ea.getLatticeConstant();

      int Nr = 2000;
      // eamAtomData.rcut = latticeConstant * sqrt(10.0) / 2.0;
      // eamAtomData.rcut = re * (pow(10.0, 0.3) + lambda);
      eamAtomData.rcut = std::min(12.0, std::max(9.0, 4.0 * re));
      // eamAtomData.rcut = re + (20.0 * re / beta);
      RealType dr = eamAtomData.rcut / (RealType)(Nr - 1);
      RealType r;

      int Nrho = 3000;
      RealType rhomax =
          max(900.0, max(2.0 * rhoe, Rho(0.0, re, fe, beta, lambda)));
      RealType drho = rhomax / (RealType)(Nrho - 1);
      RealType rho;
      RealType phiCC, phiCV;

      std::vector<RealType> rvals;
      std::vector<RealType> zvals;
      std::vector<RealType> ccvals;
      std::vector<RealType> cvvals;

      std::vector<RealType> rhovals;
      std::vector<RealType> funcvals;

      for (int i = 0; i < Nr; i++) {
        r = RealType(i) * dr;
        rvals.push_back(r);
        rhovals.push_back(Rho(r, re, fe, beta, lambda));
        phiCC = PhiCoreCore(r, re, A, alpha, kappa);
        phiCV = PhiCoreValence(r, re, B, beta, lambda);
        ccvals.push_back(phiCC);
        cvvals.push_back(phiCV);
      }
      eamAtomData.rho = std::make_shared<CubicSpline>();
      eamAtomData.rho->addPoints(rvals, rhovals);
      eamAtomData.phiCC = std::make_shared<CubicSpline>();
      eamAtomData.phiCC->addPoints(rvals, ccvals);
      eamAtomData.phiCV = std::make_shared<CubicSpline>();
      eamAtomData.phiCV->addPoints(rvals, cvvals);

      rhovals.clear();
      if (et == eamZhou2001) {
        for (int i = 0; i < Nrho; i++) {
          rho = RealType(i) * drho;
          rhovals.push_back(rho);
          funcvals.push_back(Zhou2001Functional(rho, rhoe, Fn, F, Fe, eta));
        }
      } else if (et == eamZhou2004) {
        RealType rhos = ea.getRhos();
        RealType rhol = ea.getRhol();
        RealType rhoh = ea.getRhoh();
        for (int i = 0; i < Nrho; i++) {
          rho = RealType(i) * drho;
          rhovals.push_back(rho);
          funcvals.push_back(
              Zhou2004Functional(rho, rhoe, rhos, Fn, F, Fe, eta, rhol, rhoh));
        }
      } else if (et == eamZhou2005) {
        RealType rhos    = ea.getRhos();
        RealType F3plus  = ea.getF3plus();
        RealType F3minus = ea.getF3minus();
        for (int i = 0; i < Nrho; i++) {
          rho = RealType(i) * drho;
          rhovals.push_back(rho);
          funcvals.push_back(Zhou2005Functional(rho, rhoe, rhos, Fn, F, F3plus,
                                                F3minus, Fe, eta));
        }
      } else if (et == eamZhouRose) {
        for (int i = 0; i < Nrho; i++) {
          rho = RealType(i) * drho;
          rhovals.push_back(rho);
          funcvals.push_back(RoseFunctional(rho, rhoe, F0));
        }
      }

      eamAtomData.F = std::make_shared<CubicSpline>();
      eamAtomData.F->addPoints(rhovals, funcvals);
      break;
    }
    case eamOxygenFuncfl: {
      RealType re = ea.getRe();
      RealType fe = ea.get_fe();

      RealType A      = ea.getA();
      RealType B      = ea.getB();
      RealType alpha  = ea.getAlpha();
      RealType beta   = ea.getBeta();
      RealType kappa  = ea.getKappa();
      RealType lambda = ea.getLambda();

      // RealType latticeConstant = ea.getLatticeConstant();

      int Nr = 2000;
      // eamAtomData.rcut = latticeConstant * sqrt(10.0) / 2.0;
      // eamAtomData.rcut = re * (pow(10.0, 0.3) + lambda);
      eamAtomData.rcut = std::min(12.0, std::max(9.0, 4.0 * re));
      // eamAtomData.rcut = re + (20.0 * re / beta);
      RealType dr = eamAtomData.rcut / (RealType)(Nr - 1);
      RealType r;
      RealType phiCC, phiCV;

      std::vector<RealType> rvals;
      std::vector<RealType> zvals;
      std::vector<RealType> ccvals;
      std::vector<RealType> cvvals;

      std::vector<RealType> rhovals;

      for (int i = 0; i < Nr; i++) {
        r = RealType(i) * dr;
        rvals.push_back(r);
        rhovals.push_back(Rho(r, re, fe, beta, lambda));
        phiCC = PhiCoreCore(r, re, A, alpha, kappa);
        phiCV = PhiCoreValence(r, re, B, beta, lambda);
        ccvals.push_back(phiCC);
        cvvals.push_back(phiCV);
      }
      eamAtomData.rho = std::make_shared<CubicSpline>();
      eamAtomData.rho->addPoints(rvals, rhovals);
      eamAtomData.phiCC = std::make_shared<CubicSpline>();
      eamAtomData.phiCC->addPoints(rvals, ccvals);
      eamAtomData.phiCV = std::make_shared<CubicSpline>();
      eamAtomData.phiCV->addPoints(rvals, cvvals);

      eamAtomData.F = ea.getFSpline();
      break;
    }
    case eamZhou2005Oxygen: {
      RealType re                           = ea.getRe();
      RealType fe                           = ea.get_fe();
      RealType A                            = ea.getA();
      RealType B                            = ea.getB();
      RealType alpha                        = ea.getAlpha();
      RealType beta                         = ea.getBeta();
      RealType kappa                        = ea.getKappa();
      RealType lambda                       = ea.getLambda();
      RealType gamma                        = ea.getGamma();
      RealType nu                           = ea.getNu();
      std::vector<RealType> OrhoLimits      = ea.getOrhoLimits();
      std::vector<RealType> OrhoE           = ea.getOrhoE();
      std::vector<std::vector<RealType>> OF = ea.getOF();

      int Nr = 2000;
      // eamAtomData.rcut = 6.0;
      // eamAtomData.rcut = re * (pow(10.0, 3.0/10.0) + nu );

      eamAtomData.rcut = std::min(12.0, std::max(9.0, 4.0 * re));
      // eamAtomData.rcut = re + (20.0 * re / beta);
      RealType dr = eamAtomData.rcut / (RealType)(Nr - 1);
      RealType r;

      int Nrho = 3000;
      // RealType rhomax = max(800.0, ZhouRho(0.0, re, fe, gamma, nu));
      RealType rhomax = max(800.0, Rho(0.0, re, fe, gamma, nu));
      RealType drho   = rhomax / (RealType)(Nrho - 1);
      RealType rho, phiCC, phiCV;

      std::vector<RealType> rvals;
      std::vector<RealType> zvals;
      std::vector<RealType> ccvals;
      std::vector<RealType> cvvals;

      std::vector<RealType> rhovals;
      std::vector<RealType> funcvals;

      for (int i = 0; i < Nr; i++) {
        r = RealType(i) * dr;
        rvals.push_back(r);
        rhovals.push_back(Rho(r, re, fe, gamma, nu));
        phiCC = PhiCoreCore(r, re, A, alpha, kappa);
        phiCV = PhiCoreValence(r, re, B, beta, lambda);
        ccvals.push_back(phiCC);
        cvvals.push_back(phiCV);
      }
      eamAtomData.rho = std::make_shared<CubicSpline>();
      eamAtomData.rho->addPoints(rvals, rhovals);
      eamAtomData.phiCC = std::make_shared<CubicSpline>();
      eamAtomData.phiCC->addPoints(rvals, ccvals);
      eamAtomData.phiCV = std::make_shared<CubicSpline>();
      eamAtomData.phiCV->addPoints(rvals, cvvals);

      rhovals.clear();
      for (int i = 0; i < Nrho; i++) {
        rho = RealType(i) * drho;
        rhovals.push_back(rho);
        funcvals.push_back(
            Zhou2005OxygenFunctional(rho, OrhoLimits, OrhoE, OF));
      }

      eamAtomData.F = std::make_shared<CubicSpline>();
      eamAtomData.F->addPoints(rhovals, funcvals);
      break;
    }

    case eamUnknown: {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "EAM::addType found an unknown EAM type for atomType %s\n",
               atomType->getName().c_str());
      painCave.severity = OPENMD_ERROR;
      painCave.isFatal  = 1;
      simError();
      break;
    }
    }

    FluctuatingChargeAdapter fqa = FluctuatingChargeAdapter(atomType);
    if (fqa.isFluctuatingCharge()) {
      if (fqa.isMetallic()) {
        eamAtomData.isFluctuatingCharge = true;
        eamAtomData.nValence            = fqa.getNValence();
        eamAtomData.nMobile             = fqa.getNMobile();
      } else {
        eamAtomData.isFluctuatingCharge = false;
      }
    } else {
      eamAtomData.isFluctuatingCharge = false;
    }

    // add it to the map:
    int atid   = atomType->getIdent();
    int eamtid = EAMtypes.size();

    pair<set<int>::iterator, bool> ret;
    ret = EAMtypes.insert(atid);
    if (ret.second == false) {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "EAM already had a previous entry with ident %d\n", atid);
      painCave.severity = OPENMD_INFO;
      painCave.isFatal  = 0;
      simError();
    }

    EAMtids[atid]   = eamtid;
    EAMdata[eamtid] = eamAtomData;
    MixingMap[eamtid].resize(nEAM_);

    // Now, iterate over all known types and add to the mixing map:

    std::set<int>::iterator it;
    for (it = EAMtypes.begin(); it != EAMtypes.end(); ++it) {
      int eamtid2      = EAMtids[(*it)];
      AtomType* atype2 = forceField_->getAtomType((*it));

      EAMInteractionData mixer;
      mixer.phi           = getPhi(atomType, atype2);
      mixer.rcut          = mixer.phi->getLimits().second;
      mixer.explicitlySet = false;

      MixingMap[eamtid2].resize(nEAM_);

      MixingMap[eamtid][eamtid2] = mixer;
      if (eamtid2 != eamtid) { MixingMap[eamtid2][eamtid] = mixer; }
    }
    return;
  }